

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O1

bool __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
render_lambda(basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,render_handler *handler,
             basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *var,context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *ctx,render_lambda_escape escape,string_type *text,bool parse_with_same_context)

{
  __uniq_ptr_data<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_>,_true,_true>
  _Var1;
  unique_ptr<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
  uVar2;
  size_type sVar3;
  type1 render;
  basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  renderer;
  type2 render2;
  undefined8 ***local_c8 [2];
  undefined8 **local_b8 [2];
  undefined8 **local_a8;
  undefined8 uStack_a0;
  code *local_98;
  code *pcStack_90;
  string_type *local_88;
  undefined8 ***local_80;
  undefined8 **local_78;
  undefined8 **local_70 [2];
  render_handler *local_60;
  undefined8 *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58 = (undefined8 *)0x0;
  uStack_50 = 0;
  local_88 = text;
  local_60 = handler;
  local_58 = (undefined8 *)operator_new(0x18);
  *local_58 = this;
  local_58[1] = ctx;
  *(bool *)(local_58 + 2) = parse_with_same_context;
  *(render_lambda_escape *)((long)local_58 + 0x14) = escape;
  pcStack_40 = Catch::clara::std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:1068:69)>
               ::_M_invoke;
  local_48 = Catch::clara::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:1068:69)>
             ::_M_manager;
  uStack_a0 = 0;
  pcStack_90 = Catch::clara::std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:1103:68)>
               ::_M_invoke;
  local_98 = Catch::clara::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:1103:68)>
             ::_M_manager;
  local_a8 = &local_58;
  if (var->type_ == lambda2) {
    local_80 = &local_a8;
    _Var1.
    super___uniq_ptr_impl<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_*,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_>_>
    .
    super__Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_*,_false>
    ._M_head_impl =
         (((var->lambda_)._M_t.
           super___uniq_ptr_impl<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super__Head_base<0UL,_kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
          ._M_head_impl)->type2_)._M_t.
         super___uniq_ptr_impl<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_>_>
    ;
    local_78 = &local_58;
    if (*(long *)((long)_Var1.
                        super___uniq_ptr_impl<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_*,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_>_>
                        .
                        super__Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_*,_false>
                        ._M_head_impl + 0x10) == 0) {
      std::__throw_bad_function_call();
    }
    (**(code **)((long)_Var1.
                       super___uniq_ptr_impl<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_*,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_>_>
                       .
                       super__Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_*,_false>
                       ._M_head_impl + 0x18))
              (local_c8,_Var1.
                        super___uniq_ptr_impl<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_*,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_>_>
                        .
                        super__Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_*,_false>
                        ._M_head_impl,local_88,&local_80);
    std::__cxx11::string::_M_append((char *)&ctx->line_buffer,(ulong)local_c8[0]);
    local_70[0] = local_b8[0];
    if (local_c8[0] == local_b8) goto LAB_001e010f;
  }
  else {
    render_current_line(this,local_60,ctx,
                        (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x0);
    uVar2._M_t.
    super___uniq_ptr_impl<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_*,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
    .
    super__Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_*,_false>
    ._M_head_impl =
         (((var->lambda_)._M_t.
           super___uniq_ptr_impl<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super__Head_base<0UL,_kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
          ._M_head_impl)->type1_)._M_t;
    if (*(long *)((long)uVar2._M_t.
                        super___uniq_ptr_impl<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_*,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                        .
                        super__Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_*,_false>
                        ._M_head_impl + 0x10) == 0) {
      std::__throw_bad_function_call();
    }
    (**(code **)((long)uVar2._M_t.
                       super___uniq_ptr_impl<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_*,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                       .
                       super__Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_*,_false>
                       ._M_head_impl + 0x18))
              (&local_80,
               uVar2._M_t.
               super___uniq_ptr_impl<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_*,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
               .
               super__Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_*,_false>
               ._M_head_impl,local_88);
    if (local_98 == (code *)0x0) {
      std::__throw_bad_function_call();
    }
    (*pcStack_90)(local_c8,&local_a8,&local_80);
    std::__cxx11::string::_M_append((char *)&ctx->line_buffer,(ulong)local_c8[0]);
    if (local_c8[0] != local_b8) {
      operator_delete(local_c8[0],(long)local_b8[0] + 1);
    }
    local_c8[0] = local_80;
    if (local_80 == local_70) goto LAB_001e010f;
  }
  operator_delete(local_c8[0],(long)local_70[0] + 1);
LAB_001e010f:
  sVar3 = (this->error_message_)._M_string_length;
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  return sVar3 == 0;
}

Assistant:

bool render_lambda(const render_handler& handler, const basic_data<string_type>* var, context_internal<string_type>& ctx, render_lambda_escape escape, const string_type& text, bool parse_with_same_context) {
        const typename basic_renderer<string_type>::type2 render2 = [this, &ctx, parse_with_same_context, escape](const string_type& text, bool escaped) {
            const auto process_template = [this, &ctx, escape, escaped](basic_mustache& tmpl) -> string_type {
                if (!tmpl.is_valid()) {
                    error_message_ = tmpl.error_message();
                    return {};
                }
                context_internal<string_type> render_ctx{ctx.ctx}; // start a new line_buffer
                const auto str = tmpl.render(render_ctx);
                if (!tmpl.is_valid()) {
                    error_message_ = tmpl.error_message();
                    return {};
                }
                bool do_escape = false;
                switch (escape) {
                    case render_lambda_escape::escape:
                        do_escape = true;
                        break;
                    case render_lambda_escape::unescape:
                        do_escape = false;
                        break;
                    case render_lambda_escape::optional:
                        do_escape = escaped;
                        break;
                }
                return do_escape ? escape_(str) : str;
            };
            if (parse_with_same_context) {
                basic_mustache tmpl{text, ctx};
                tmpl.set_custom_escape(escape_);
                return process_template(tmpl);
            }
            basic_mustache tmpl{text};
            tmpl.set_custom_escape(escape_);
            return process_template(tmpl);
        };
        const typename basic_renderer<string_type>::type1 render = [&render2](const string_type& text) {
            return render2(text, false);
        };
        if (var->is_lambda2()) {
            const basic_renderer<string_type> renderer{render, render2};
            render_result(ctx, var->lambda2_value()(text, renderer));
        } else {
            render_current_line(handler, ctx, nullptr);
            render_result(ctx, render(var->lambda_value()(text)));
        }
        return error_message_.empty();
    }